

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::ReplaceInductionUseWithFinalValue
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  IRContext *pIVar1;
  Instruction *phi;
  Analysis AVar2;
  uint32_t uVar3;
  uint32_t before;
  size_type sVar4;
  reference ppIVar5;
  ulong uStack_38;
  uint32_t trip_step_id;
  size_t index;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  pIVar1 = this->context_;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)loop;
  AVar2 = opt::operator|(kAnalysisLoopAnalysis,kAnalysisBegin);
  AVar2 = opt::operator|(AVar2,kAnalysisInstrToBlockMapping);
  IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar2);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &index);
  Loop::GetInductionVariables
            ((Loop *)inductions.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &index);
  uStack_38 = 0;
  while( true ) {
    sVar4 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&index);
    if (sVar4 <= uStack_38) break;
    ppIVar5 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[](&(this->state_).previous_phis_,uStack_38);
    phi = *ppIVar5;
    uVar3 = BasicBlock::id((this->state_).previous_latch_block_);
    uVar3 = GetPhiDefID(this,phi,uVar3);
    pIVar1 = this->context_;
    ppIVar5 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[]((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&index,uStack_38);
    before = opt::Instruction::result_id(*ppIVar5);
    IRContext::ReplaceAllUsesWith(pIVar1,before,uVar3);
    ppIVar5 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[]((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&index,uStack_38);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back(&this->invalidated_instructions_,ppIVar5);
    uStack_38 = uStack_38 + 1;
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &index);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::ReplaceInductionUseWithFinalValue(Loop* loop) {
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse |
      IRContext::Analysis::kAnalysisInstrToBlockMapping);

  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);

  for (size_t index = 0; index < inductions.size(); ++index) {
    uint32_t trip_step_id = GetPhiDefID(state_.previous_phis_[index],
                                        state_.previous_latch_block_->id());
    context_->ReplaceAllUsesWith(inductions[index]->result_id(), trip_step_id);
    invalidated_instructions_.push_back(inductions[index]);
  }
}